

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

cmValue __thiscall
cmGeneratorTarget::GetFilePrefixInternal
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *language)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  cmValue cVar3;
  ArtifactType artifact_00;
  char *prefixVar;
  string langPrefix;
  allocator<char> local_51;
  char *local_50;
  string local_48;
  
  TVar2 = GetType(this);
  if (TVar2 == STATIC_LIBRARY) {
LAB_00484db8:
    if (artifact == ImportLibraryArtifact) {
      bVar1 = NeedImportLibraryName(this,config);
      if (!bVar1) goto LAB_00484ec4;
    }
    TVar2 = GetType(this);
    artifact_00 = artifact;
    if (TVar2 != SHARED_LIBRARY) {
      TVar2 = GetType(this);
      if (TVar2 != MODULE_LIBRARY) {
        TVar2 = GetType(this);
        artifact_00 = RuntimeBinaryArtifact;
        if (TVar2 == EXECUTABLE) {
          artifact_00 = artifact;
        }
      }
    }
    if (artifact == ImportLibraryArtifact) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"IMPORT_PREFIX",(allocator<char> *)&local_50);
      cVar3 = GetProperty(this,&local_48);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"PREFIX",(allocator<char> *)&local_50);
      cVar3 = GetProperty(this,&local_48);
    }
    std::__cxx11::string::~string((string *)&local_48);
    if (cVar3.Value == (string *)0x0) {
      local_50 = cmTarget::GetPrefixVariableInternal(this->Target,artifact_00);
      cVar3.Value = (string *)0x0;
      if ((local_50 != (char *)0x0) && (language->_M_string_length != 0)) {
        if (*local_50 == '\0') {
          cVar3.Value = (string *)0x0;
        }
        else {
          cmStrCat<char_const*&,char_const(&)[2],std::__cxx11::string_const&>
                    (&local_48,&local_50,(char (*) [2])0x75c805,language);
          cVar3 = cmMakefile::GetDefinition(this->Makefile,&local_48);
          std::__cxx11::string::~string((string *)&local_48);
        }
      }
      if ((cVar3.Value == (string *)0x0) && (local_50 != (char *)0x0)) {
        this_00 = this->Makefile;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,local_50,&local_51);
        cVar3 = cmMakefile::GetDefinition(this_00,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
      }
    }
  }
  else {
    TVar2 = GetType(this);
    if (TVar2 == SHARED_LIBRARY) goto LAB_00484db8;
    TVar2 = GetType(this);
    if (TVar2 == MODULE_LIBRARY) goto LAB_00484db8;
    TVar2 = GetType(this);
    if (TVar2 == EXECUTABLE) goto LAB_00484db8;
LAB_00484ec4:
    cVar3.Value = (string *)0x0;
  }
  return (cmValue)cVar3.Value;
}

Assistant:

cmValue cmGeneratorTarget::GetFilePrefixInternal(
  std::string const& config, cmStateEnums::ArtifactType artifact,
  const std::string& language) const
{
  // no prefix for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    return nullptr;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty prefix for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact && !this->NeedImportLibraryName(config)) {
    return nullptr;
  }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute prefix value.
  cmValue targetPrefix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_PREFIX")
                               : this->GetProperty("PREFIX"));

  if (!targetPrefix) {
    const char* prefixVar = this->Target->GetPrefixVariableInternal(artifact);
    if (!language.empty() && cmNonempty(prefixVar)) {
      std::string langPrefix = cmStrCat(prefixVar, "_", language);
      targetPrefix = this->Makefile->GetDefinition(langPrefix);
    }

    // if there is no prefix on the target nor specific language
    // use the cmake definition.
    if (!targetPrefix && prefixVar) {
      targetPrefix = this->Makefile->GetDefinition(prefixVar);
    }
  }

  return targetPrefix;
}